

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>
::DenseMapIterator(DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>
                   *this,pointer Pos,pointer E,DebugEpochBase *Epoch,bool NoAdvance)

{
  bool bVar1;
  bool NoAdvance_local;
  DebugEpochBase *Epoch_local;
  pointer E_local;
  pointer Pos_local;
  DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>
  *this_local;
  
  DebugEpochBase::HandleBase::HandleBase((HandleBase *)this,Epoch);
  this->Ptr = Pos;
  this->End = E;
  bVar1 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)this);
  if (bVar1) {
    if (!NoAdvance) {
      bVar1 = shouldReverseIterate<unsigned_short>();
      if (bVar1) {
        RetreatPastEmptyBuckets(this);
      }
      else {
        AdvancePastEmptyBuckets(this);
      }
    }
    return;
  }
  __assert_fail("isHandleInSync() && \"invalid construction!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x49f,
                "llvm::DenseMapIterator<unsigned short, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<unsigned short>, llvm::detail::DenseSetPair<unsigned short>>::DenseMapIterator(pointer, pointer, const DebugEpochBase &, bool) [KeyT = unsigned short, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<unsigned short>, Bucket = llvm::detail::DenseSetPair<unsigned short>, IsConst = false]"
               );
}

Assistant:

DenseMapIterator(pointer Pos, pointer E, const DebugEpochBase &Epoch,
                   bool NoAdvance = false)
      : DebugEpochBase::HandleBase(&Epoch), Ptr(Pos), End(E) {
    assert(isHandleInSync() && "invalid construction!");

    if (NoAdvance) return;
    if (shouldReverseIterate<KeyT>()) {
      RetreatPastEmptyBuckets();
      return;
    }
    AdvancePastEmptyBuckets();
  }